

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O2

char * conf_get_str_nthstrkey(Conf *conf,int primary,int n)

{
  int *piVar1;
  int index;
  constkey key;
  
  if (subkeytypes[primary] != 3) {
    __assert_fail("subkeytypes[primary] == TYPE_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x16e,"char *conf_get_str_nthstrkey(Conf *, int, int)");
  }
  if (valuetypes[primary] == 3) {
    key.secondary.s = "";
    key.primary = primary;
    piVar1 = (int *)findrelpos234(conf->tree,&key,conf_cmp_constkey,4,&index);
    if ((((piVar1 != (int *)0x0) && (*piVar1 == primary)) &&
        (piVar1 = (int *)index234(conf->tree,n + index), piVar1 != (int *)0x0)) &&
       (*piVar1 == primary)) {
      return *(char **)(piVar1 + 2);
    }
    return (char *)0x0;
  }
  __assert_fail("valuetypes[primary] == TYPE_STR",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x16f,"char *conf_get_str_nthstrkey(Conf *, int, int)");
}

Assistant:

char *conf_get_str_nthstrkey(Conf *conf, int primary, int n)
{
    struct constkey key;
    struct conf_entry *entry;
    int index;

    assert(subkeytypes[primary] == TYPE_STR);
    assert(valuetypes[primary] == TYPE_STR);
    key.primary = primary;
    key.secondary.s = "";
    entry = findrelpos234(conf->tree, &key, conf_cmp_constkey,
                          REL234_GE, &index);
    if (!entry || entry->key.primary != primary)
        return NULL;
    entry = index234(conf->tree, index + n);
    if (!entry || entry->key.primary != primary)
        return NULL;
    return entry->key.secondary.s;
}